

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O3

void __thiscall
draco::AttributeQuantizationTransform::GeneratePortableAttribute
          (AttributeQuantizationTransform *this,PointAttribute *attribute,int num_points,
          PointAttribute *target_attribute)

{
  byte bVar1;
  bool bVar2;
  long lVar3;
  pointer pfVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  void *__dest;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  Quantizer quantizer;
  Quantizer local_64;
  long local_60;
  pointer local_58;
  ulong local_50;
  size_t local_48;
  DataBuffer *local_40;
  long local_38;
  
  bVar1 = (attribute->super_GeometryAttribute).num_components_;
  lVar3 = (target_attribute->super_GeometryAttribute).byte_offset_;
  local_60 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  iVar5 = this->quantization_bits_;
  Quantizer::Quantizer(&local_64);
  Quantizer::Init(&local_64,this->range_,~(-1 << ((byte)iVar5 & 0x1f)));
  __dest = operator_new__((ulong)((uint)bVar1 * 4));
  if (num_points != 0) {
    bVar2 = attribute->identity_mapping_;
    local_58 = (attribute->indices_map_).vector_.
               super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_38 = (attribute->super_GeometryAttribute).byte_offset_;
    local_40 = (attribute->super_GeometryAttribute).buffer_;
    local_48 = (attribute->super_GeometryAttribute).byte_stride_;
    pfVar4 = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_50 = (ulong)(uint)num_points;
    local_60 = local_60 + lVar3;
    uVar8 = 0;
    iVar7 = 0;
    do {
      uVar6 = (uint)uVar8;
      if (bVar2 == false) {
        uVar6 = local_58[uVar8].value_;
      }
      memcpy(__dest,(void *)((long)(local_40->data_).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_38 +
                            uVar6 * local_48),local_48);
      if ((ulong)bVar1 != 0) {
        lVar3 = local_60 + (long)iVar7 * 4;
        uVar9 = 0;
        do {
          fVar10 = floorf((*(float *)((long)__dest + uVar9 * 4) - pfVar4[uVar9]) *
                          local_64.inverse_delta_ + 0.5);
          *(int *)(lVar3 + uVar9 * 4) = (int)fVar10;
          uVar9 = uVar9 + 1;
        } while (bVar1 != uVar9);
        iVar7 = iVar7 + (int)uVar9;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_50);
  }
  operator_delete__(__dest);
  return;
}

Assistant:

void AttributeQuantizationTransform::GeneratePortableAttribute(
    const PointAttribute &attribute, int num_points,
    PointAttribute *target_attribute) const {
  DRACO_DCHECK(is_initialized());

  const int num_components = attribute.num_components();

  // Quantize all values using the order given by point_ids.
  int32_t *const portable_attribute_data = reinterpret_cast<int32_t *>(
      target_attribute->GetAddress(AttributeValueIndex(0)));
  const uint32_t max_quantized_value = (1 << (quantization_bits_)) - 1;
  Quantizer quantizer;
  quantizer.Init(range(), max_quantized_value);
  int32_t dst_index = 0;
  const std::unique_ptr<float[]> att_val(new float[num_components]);
  for (PointIndex i(0); i < num_points; ++i) {
    const AttributeValueIndex att_val_id = attribute.mapped_index(i);
    attribute.GetValue(att_val_id, att_val.get());
    for (int c = 0; c < num_components; ++c) {
      const float value = (att_val[c] - min_values()[c]);
      const int32_t q_val = quantizer.QuantizeFloat(value);
      portable_attribute_data[dst_index++] = q_val;
    }
  }
}